

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pssw.c
# Opt level: O1

parasail_result_ssw_t *
parasail_ssw_profile(parasail_profile_t *profile,char *s2,int s2Len_,int open,int gap)

{
  char *s;
  parasail_matrix_t *matrix;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  parasail_result_t *result;
  char *s1;
  char *s2_00;
  parasail_result_t *result_00;
  parasail_result_t *result_01;
  parasail_cigar_t *__ptr;
  parasail_result_ssw_t *ppVar6;
  int iVar7;
  size_t length;
  long lVar8;
  int iVar9;
  size_t length_00;
  long lVar10;
  bool bVar11;
  
  s = profile->s1;
  matrix = profile->matrix;
  bVar11 = (profile->profile8).score == (void *)0x0;
  bVar2 = !bVar11;
  pvVar1 = (profile->profile16).score;
  if (bVar11) {
    result = (parasail_result_t *)0x0;
  }
  else {
    result = parasail_sw_striped_profile_8(profile,s2,s2Len_,open,gap);
    iVar3 = parasail_result_is_saturated(result);
    if (iVar3 == 0) {
      bVar2 = true;
    }
    else {
      parasail_result_free(result);
      result = (parasail_result_t *)0x0;
      bVar2 = false;
    }
  }
  if (result == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
    result = parasail_sw_striped_profile_16(profile,s2,s2Len_,open,gap);
    iVar3 = parasail_result_is_saturated(result);
    if (iVar3 != 0) {
      parasail_result_free(result);
      result = (parasail_result_t *)0x0;
    }
  }
  if (result == (parasail_result_t *)0x0) {
    return (parasail_result_ssw_t *)0x0;
  }
  length = (long)result->end_query + 1;
  length_00 = (long)result->end_ref + 1;
  s1 = parasail_reverse(s,length);
  s2_00 = parasail_reverse(s2,length_00);
  bVar11 = true;
  iVar3 = (int)length;
  iVar7 = (int)length_00;
  if (bVar2) {
    result_00 = parasail_sw_striped_8(s1,iVar3,s2_00,iVar7,open,gap,matrix);
    iVar4 = parasail_result_is_saturated(result_00);
    if (iVar4 == 0) {
      bVar11 = false;
      goto LAB_004b4fd0;
    }
    parasail_result_free(result_00);
  }
  result_00 = (parasail_result_t *)0x0;
LAB_004b4fd0:
  if (result_00 == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
    result_00 = parasail_sw_striped_16(s1,iVar3,s2_00,iVar7,open,gap,matrix);
    iVar3 = parasail_result_is_saturated(result_00);
    if (iVar3 != 0) {
      parasail_result_free(result_00);
      result_00 = (parasail_result_t *)0x0;
    }
  }
  free(s2_00);
  free(s1);
  if (result_00 == (parasail_result_t *)0x0) {
    ppVar6 = (parasail_result_ssw_t *)0x0;
  }
  else {
    lVar10 = (long)result->end_query - (long)result_00->end_query;
    lVar8 = (long)result->end_ref - (long)result_00->end_ref;
    iVar3 = result_00->end_query + 1;
    iVar7 = result_00->end_ref + 1;
    if (bVar11) {
      result_01 = (parasail_result_t *)0x0;
    }
    else {
      result_01 = parasail_sw_trace_striped_8(s + lVar10,iVar3,s2 + lVar8,iVar7,open,gap,matrix);
      iVar4 = parasail_result_is_saturated(result_01);
      if (iVar4 != 0) {
        parasail_result_free(result_01);
        result_01 = (parasail_result_t *)0x0;
      }
    }
    iVar9 = (int)lVar10;
    iVar4 = (int)lVar8;
    if (result_01 == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
      result_01 = parasail_sw_trace_striped_16(s + iVar9,iVar3,s2 + iVar4,iVar7,open,gap,matrix);
      iVar5 = parasail_result_is_saturated(result_01);
      if (iVar5 != 0) {
        parasail_result_free(result_01);
        result_01 = (parasail_result_t *)0x0;
      }
    }
    if (result_01 == (parasail_result_t *)0x0) {
      ppVar6 = (parasail_result_ssw_t *)0x0;
    }
    else {
      __ptr = parasail_result_get_cigar(result_01,s + iVar9,iVar3,s2 + iVar4,iVar7,matrix);
      ppVar6 = (parasail_result_ssw_t *)malloc(0x28);
      ppVar6->score1 = (uint16_t)result->score;
      ppVar6->ref_begin1 = iVar4;
      ppVar6->ref_end1 = result->end_ref;
      ppVar6->read_begin1 = iVar9;
      ppVar6->read_end1 = result->end_query;
      ppVar6->cigar = __ptr->seq;
      ppVar6->cigarLen = __ptr->len;
      free(__ptr);
      parasail_result_free(result_01);
    }
    parasail_result_free(result_00);
  }
  parasail_result_free(result);
  return ppVar6;
}

Assistant:

parasail_result_ssw_t* parasail_ssw_profile(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len_,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;
    parasail_result_t *result_forward = NULL;
    parasail_result_t *result_reverse = NULL;
    parasail_result_t *result_final = NULL;
    parasail_result_ssw_t *result_ssw = NULL;
    int has8 = 0;
    int has16 = 0;
    char *s1_reverse = NULL;
    char *s2_reverse = NULL;
    int s1Len = 0;
    int s2Len = 0;
    int s1Off = 0;
    int s2Off = 0;
    parasail_cigar_t *cigar = NULL;

    /* find the end loc first with the faster implementation */
    has8 = (NULL != profile->profile8.score);
    has16 = (NULL != profile->profile16.score);

    /* find the end loc first with the faster implementation */
    if (has8) {
        result_forward = parasail_sw_striped_profile_8(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            has8 = 0;
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    if (NULL == result_forward && has16) {
        result_forward = parasail_sw_striped_profile_16(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    /* 8- and/or 16-bit options could fail */
    if (NULL == result_forward) {
        return NULL;
    }

    /* find beginning loc by going in reverse */
    s1Len = result_forward->end_query+1;
    s2Len = result_forward->end_ref+1;
    s1_reverse = parasail_reverse(s1, s1Len);
    s2_reverse = parasail_reverse(s2, s2Len);
    if (has8) {
        result_reverse = parasail_sw_striped_8(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            has8 = 0;
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    if (NULL == result_reverse && has16) {
        result_reverse = parasail_sw_striped_16(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    free(s2_reverse);
    free(s1_reverse);

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_reverse) {
        parasail_result_free(result_forward); /* free the forward result */
        return NULL;
    }

    /* run trace version of sw on just the aligned portion */
    s1Off = result_forward->end_query - result_reverse->end_query;
    s2Off = result_forward->end_ref - result_reverse->end_ref;
    s1Len = result_reverse->end_query+1;
    s2Len = result_reverse->end_ref+1;
    if (has8) {
        result_final = parasail_sw_trace_striped_8(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            has8 = 0;
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }
    if (NULL == result_final && has16) {
        result_final = parasail_sw_trace_striped_16(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_final) {
        parasail_result_free(result_reverse); /* free reverse result */
        parasail_result_free(result_forward); /* free forward result */
        return NULL;
    }

    /* get cigar from traceback */
    cigar = parasail_result_get_cigar(result_final,
            &s1[s1Off], s1Len,
            &s2[s2Off], s2Len,
            matrix);

    result_ssw = (parasail_result_ssw_t*)malloc(sizeof(parasail_result_ssw_t));
    result_ssw->score1 = result_forward->score;
    result_ssw->ref_begin1 = s2Off;
    result_ssw->ref_end1 = result_forward->end_ref;
    result_ssw->read_begin1 = s1Off;
    result_ssw->read_end1 = result_forward->end_query;
    result_ssw->cigar = cigar->seq;
    result_ssw->cigarLen = cigar->len;

    free(cigar);
    parasail_result_free(result_final);
    parasail_result_free(result_reverse);
    parasail_result_free(result_forward);

    return result_ssw;;
}